

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperFastHash.cpp
# Opt level: O0

uint32_t SuperFastHash(char *data,int len,int32_t hash)

{
  uint uVar1;
  uint uVar2;
  int rem;
  uint32_t tmp;
  int32_t hash_local;
  int len_local;
  char *data_local;
  uint32_t local_24;
  
  if ((len < 1) || (data == (char *)0x0)) {
    local_24 = 0;
  }
  else {
    uVar1 = len & 3;
    hash_local = hash;
    data_local = data;
    for (len_local = len >> 2; 0 < len_local; len_local = len_local + -1) {
      uVar2 = ((uint)*(ushort *)data_local + hash_local) * 0x10000 ^
              (uint)*(ushort *)(data_local + 2) << 0xb ^ (uint)*(ushort *)data_local + hash_local;
      data_local = data_local + 4;
      hash_local = ((int)uVar2 >> 0xb) + uVar2;
    }
    if (uVar1 == 1) {
      uVar1 = (*data_local + hash_local) * 0x400 ^ *data_local + hash_local;
      hash_local = ((int)uVar1 >> 1) + uVar1;
    }
    else if (uVar1 == 2) {
      uVar1 = ((uint)*(ushort *)data_local + hash_local) * 0x800 ^
              (uint)*(ushort *)data_local + hash_local;
      hash_local = ((int)uVar1 >> 0x11) + uVar1;
    }
    else if (uVar1 == 3) {
      uVar1 = (int)data_local[2] << 0x12 ^
              ((uint)*(ushort *)data_local + hash_local) * 0x10000 ^
              (uint)*(ushort *)data_local + hash_local;
      hash_local = ((int)uVar1 >> 0xb) + uVar1;
    }
    uVar1 = hash_local << 3 ^ hash_local;
    uVar1 = ((int)uVar1 >> 5) + uVar1;
    uVar1 = uVar1 * 0x10 ^ uVar1;
    uVar1 = ((int)uVar1 >> 0x11) + uVar1;
    uVar1 = uVar1 * 0x2000000 ^ uVar1;
    local_24 = ((int)uVar1 >> 6) + uVar1;
  }
  return local_24;
}

Assistant:

uint32_t SuperFastHash (const char * data, int len, int32_t hash) {
  uint32_t tmp;
  int rem;

  if (len <= 0 || !data) return 0;

  rem = len & 3;
  len >>= 2;

  /* Main loop */
  for (;len > 0; len--) {
    hash  += get16bits (data);
    tmp    = (get16bits (data+2) << 11) ^ hash;
    hash   = (hash << 16) ^ tmp;
    data  += 2*sizeof (uint16_t);
    hash  += hash >> 11;
  }

  /* Handle end cases */
  switch (rem) {
    case 3:	hash += get16bits (data);
        hash ^= hash << 16;
        hash ^= data[sizeof (uint16_t)] << 18;
        hash += hash >> 11;
        break;
    case 2:	hash += get16bits (data);
        hash ^= hash << 11;
        hash += hash >> 17;
        break;
    case 1: hash += *data;
        hash ^= hash << 10;
        hash += hash >> 1;
  }

  /* Force "avalanching" of final 127 bits */
  hash ^= hash << 3;
  hash += hash >> 5;
  hash ^= hash << 4;
  hash += hash >> 17;
  hash ^= hash << 25;
  hash += hash >> 6;

  return hash;
}